

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall
VW::config::base_option::base_option(base_option *this,string *name,size_t type_hash)

{
  pointer pcVar1;
  
  this->_vptr_base_option = (_func_int **)&PTR__base_option_002d5f78;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_type_hash = type_hash;
  (this->m_help)._M_dataplus._M_p = (pointer)&(this->m_help).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_help,"");
  (this->m_short_name)._M_dataplus._M_p = (pointer)&(this->m_short_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_short_name,"");
  this->m_keep = false;
  return;
}

Assistant:

base_option(std::string name, size_t type_hash) : m_name(name), m_type_hash(type_hash) {}